

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O1

shared_ptr<UIContext> CreateUIContext(GraphicsContext *gc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  GraphicsContext *in_RSI;
  shared_ptr<UIContext> sVar1;
  shared_ptr<GusteauChapter1UI> ui;
  undefined1 local_31;
  int local_30 [2];
  GraphicsContext local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_30[1] = 0x400;
  local_30[0] = 0x400;
  local_28._vptr_GraphicsContext = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<GusteauChapter1UI,std::allocator<GusteauChapter1UI>,GraphicsContext&,char_const(&)[8],int,int>
            (&_Stack_20,(GusteauChapter1UI **)&local_28,(allocator<GusteauChapter1UI> *)&local_31,
             in_RSI,(char (*) [8])"gusteau",local_30 + 1,local_30);
  gc[1]._vptr_GraphicsContext = (_func_int **)0x0;
  gc->_vptr_GraphicsContext = (_func_int **)local_28;
  gc[1]._vptr_GraphicsContext = (_func_int **)_Stack_20._M_pi;
  sVar1.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)gc;
  return (shared_ptr<UIContext>)sVar1.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UIContext> CreateUIContext(GraphicsContext& gc)
{
    auto ui = std::make_shared<GusteauChapter1UI>(gc, "gusteau", 1024, 1024);
    return ui;
}